

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_parser.cpp
# Opt level: O2

void __thiscall cmd_paresr::cmd_paresr(cmd_paresr *this,int argc,char **argv)

{
  ulong uVar1;
  ulong uVar2;
  int local_9c;
  queue<std::queue<int,_std::deque<int,_std::allocator<int>_>_>,_std::deque<std::queue<int,_std::deque<int,_std::allocator<int>_>_>,_std::allocator<std::queue<int,_std::deque<int,_std::allocator<int>_>_>_>_>_>
  *local_98;
  queue<char,_std::deque<char,_std::allocator<char>_>_> *local_90;
  cmd_paresr *local_88;
  queue<int,_std::deque<int,_std::allocator<int>_>_> tmp;
  
  local_90 = &this->ops;
  std::queue<char,std::deque<char,std::allocator<char>>>::
  queue<std::deque<char,std::allocator<char>>,void>(local_90);
  local_98 = &this->args;
  std::
  queue<std::queue<int,std::deque<int,std::allocator<int>>>,std::deque<std::queue<int,std::deque<int,std::allocator<int>>>,std::allocator<std::queue<int,std::deque<int,std::allocator<int>>>>>>
  ::
  queue<std::deque<std::queue<int,std::deque<int,std::allocator<int>>>,std::allocator<std::queue<int,std::deque<int,std::allocator<int>>>>>,void>
            (local_98);
  this->opnum = 0;
  this->pos = 0;
  uVar2 = 1;
  local_88 = this;
  while ((int)uVar2 < argc) {
    uVar1 = (ulong)(int)uVar2;
    std::deque<char,_std::allocator<char>_>::push_back(&local_90->c,argv[uVar1] + 1);
    std::queue<int,std::deque<int,std::allocator<int>>>::
    queue<std::deque<int,std::allocator<int>>,void>(&tmp);
    local_88->opnum = local_88->opnum + 1;
    while ((uVar1 = uVar1 + 1, uVar2 = (ulong)(uint)argc, (long)uVar1 < (long)argc &&
           (uVar2 = uVar1, *argv[uVar1] != '-'))) {
      local_9c = atoi(argv[uVar1]);
      std::deque<int,_std::allocator<int>_>::emplace_back<int>
                ((deque<int,_std::allocator<int>_> *)&tmp,&local_9c);
    }
    std::
    deque<std::queue<int,_std::deque<int,_std::allocator<int>_>_>,_std::allocator<std::queue<int,_std::deque<int,_std::allocator<int>_>_>_>_>
    ::push_back(&local_98->c,(value_type *)&tmp);
    std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
              ((_Deque_base<int,_std::allocator<int>_> *)&tmp);
  }
  return;
}

Assistant:

cmd_paresr::cmd_paresr(int argc, char **argv) {
  pos = 0;
  opnum = 0;
  for (int i = 1; i < argc; i++) {
    // Set operation
    ops.push(argv[i][1]);
    queue<int> tmp;
    opnum++;
    i++;
    // Get args
    while (i < argc && argv[i][0] != '-')
      tmp.push(atoi(argv[i++]));
    // Set args
    args.push(tmp);
    i--;
  }
}